

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_sar_mod_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b)

{
  TCGTemp *ts;
  uintptr_t o;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_andi_i64_tricore(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),b,0x3f);
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_sar_i64,(TCGArg)(d + (long)tcg_ctx),
                      (TCGArg)(a + (long)tcg_ctx),(TCGArg)ts);
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  return;
}

Assistant:

static void tcg_gen_sar_mod_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andi_i64(tcg_ctx, t, b, 63);
    tcg_gen_sar_i64(tcg_ctx, d, a, t);
    tcg_temp_free_i64(tcg_ctx, t);
}